

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec,xmlChar *value,void *data)

{
  int iVar1;
  xmlRegInputTokenPtr pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  
  iVar1 = exec->inputStackMax;
  if ((long)iVar1 == 0) {
    exec->inputStackMax = 4;
    pxVar2 = (xmlRegInputTokenPtr)(*xmlMalloc)(0x40);
    exec->inputStack = pxVar2;
    if (pxVar2 == (xmlRegInputTokenPtr)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"pushing input string");
      exec->inputStackMax = 0;
      return;
    }
  }
  else if (iVar1 <= exec->inputStackNr + 1) {
    exec->inputStackMax = iVar1 * 2;
    pxVar2 = (xmlRegInputTokenPtr)(*xmlRealloc)(exec->inputStack,(long)iVar1 << 5);
    if (pxVar2 == (xmlRegInputTokenPtr)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"pushing input string");
      exec->inputStackMax = exec->inputStackMax / 2;
      return;
    }
    exec->inputStack = pxVar2;
  }
  pxVar3 = xmlStrdup(value);
  pxVar2 = exec->inputStack;
  lVar4 = (long)exec->inputStackNr;
  pxVar2[lVar4].value = pxVar3;
  pxVar2[lVar4].data = data;
  exec->inputStackNr = (int)(lVar4 + 1);
  pxVar2[lVar4 + 1].value = (xmlChar *)0x0;
  pxVar2[lVar4 + 1].data = (void *)0x0;
  return;
}

Assistant:

static void
xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                    void *data) {
#ifdef DEBUG_PUSH
    printf("saving value: %d:%s\n", exec->inputStackNr, value);
#endif
    if (exec->inputStackMax == 0) {
	exec->inputStackMax = 4;
	exec->inputStack = (xmlRegInputTokenPtr)
	    xmlMalloc(exec->inputStackMax * sizeof(xmlRegInputToken));
	if (exec->inputStack == NULL) {
	    xmlRegexpErrMemory(NULL, "pushing input string");
	    exec->inputStackMax = 0;
	    return;
	}
    } else if (exec->inputStackNr + 1 >= exec->inputStackMax) {
	xmlRegInputTokenPtr tmp;

	exec->inputStackMax *= 2;
	tmp = (xmlRegInputTokenPtr) xmlRealloc(exec->inputStack,
			exec->inputStackMax * sizeof(xmlRegInputToken));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(NULL, "pushing input string");
	    exec->inputStackMax /= 2;
	    return;
	}
	exec->inputStack = tmp;
    }
    exec->inputStack[exec->inputStackNr].value = xmlStrdup(value);
    exec->inputStack[exec->inputStackNr].data = data;
    exec->inputStackNr++;
    exec->inputStack[exec->inputStackNr].value = NULL;
    exec->inputStack[exec->inputStackNr].data = NULL;
}